

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 neon_load_scratch(TCGContext_conflict1 *tcg_ctx,int scratch)

{
  TCGTemp *a1;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (long)scratch * 4 + 0x2ea8);
  return (TCGv_i32)((long)a1 - (long)tcg_ctx);
}

Assistant:

static TCGv_i32 neon_load_scratch(TCGContext *tcg_ctx, int scratch)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, tmp, tcg_ctx->cpu_env, offsetof(CPUARMState, vfp.scratch[scratch]));
    return tmp;
}